

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O2

double __thiscall HyperGraph::self_inf_cal(HyperGraph *this,Nodelist *vecSeed)

{
  uint *puVar1;
  pointer pvVar2;
  size_type *psVar3;
  difference_type dVar4;
  uint *puVar5;
  size_type *psVar6;
  Nodelist *__range1;
  reference rVar7;
  _Bit_iterator __first;
  _Bit_iterator __last;
  vector<bool,_std::allocator<bool>_> vecBoolVst;
  vector<bool,_std::allocator<bool>_> vecBoolSeed;
  allocator_type local_89;
  double local_88;
  undefined1 local_80 [40];
  _Bvector_base<std::allocator<bool>_> local_58;
  
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_80,this->__numRRsets,
             (allocator_type *)&local_58);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,(ulong)this->__numV,&local_89);
  puVar1 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_58,(ulong)*puVar5);
    *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
  }
  puVar1 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    pvVar2 = (this->_FRsets).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = *(pointer *)
              ((long)&pvVar2[*puVar5].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (psVar6 = pvVar2[*puVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_80,*psVar6);
      *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
    }
  }
  local_89 = (allocator_type)0x1;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p = (_Bit_type *)local_80._0_8_;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)local_80._16_8_;
  __last.super__Bit_iterator_base._M_offset = local_80._24_4_;
  dVar4 = std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                    (__first,__last,(_Iter_equals_val<const_bool>)&local_89);
  local_88 = ((double)this->__numV * (double)dVar4) /
             (((double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0));
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)local_80);
  return local_88;
}

Assistant:

double self_inf_cal(const Nodelist& vecSeed)
    {
        std::vector<bool> vecBoolVst = std::vector<bool>(__numRRsets);
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;
        for (auto seed : vecSeed)
        {
            for (auto node : _FRsets[seed])
            {
                vecBoolVst[node] = true;
            }
        }
        return 1.0 * std::count(vecBoolVst.begin(), vecBoolVst.end(), true) * __numV / __numRRsets;
    }